

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,FPolyObj *poly,FPolyObj *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  DAngle angle;
  double local_40;
  DVector2 local_38;
  DAngle local_20;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    local_40 = (poly->Angle).Degrees;
    local_38.X = (poly->StartSpot).pos.X;
    local_38.Y = (poly->StartSpot).pos.Y;
    pFVar2 = Serialize(arc,"angle",&local_40,(double *)0x0);
    pFVar2 = FSerializer::Array<double>(pFVar2,"pos",&local_38.X,(double *)0x0,2,true);
    Serialize(pFVar2,"interpolation",(DObject **)&poly->interpolation,(DObject **)0x0,(bool *)0x0);
    pFVar2 = Serialize(pFVar2,"blocked",&poly->bBlocked,(bool *)0x0);
    pFVar2 = Serialize(pFVar2,"hasportals",&poly->bHasPortals,(uint8_t *)0x0);
    Serialize(pFVar2,"specialdata",(DObject **)&poly->specialdata,(DObject **)0x0,(bool *)0x0);
    FSerializer::EndObject(pFVar2);
    if (arc->r != (FReader *)0x0) {
      local_20.Degrees = local_40;
      FPolyObj::RotatePolyobj(poly,&local_20,true);
      local_38.X = local_38.X - (poly->StartSpot).pos.X;
      local_38.Y = local_38.Y - (poly->StartSpot).pos.Y;
      FPolyObj::MovePolyobj(poly,&local_38,true);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FPolyObj &poly, FPolyObj *def)
{
	if (arc.BeginObject(key))
	{
		DAngle angle = poly.Angle;
		DVector2 delta = poly.StartSpot.pos;
		arc("angle", angle)
			("pos", delta)
			("interpolation", poly.interpolation)
			("blocked", poly.bBlocked)
			("hasportals", poly.bHasPortals)
			("specialdata", poly.specialdata)
			.EndObject();

		if (arc.isReading())
		{
			poly.RotatePolyobj(angle, true);
			delta -= poly.StartSpot.pos;
			poly.MovePolyobj(delta, true);
		}
	}
	return arc;
}